

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerLdArrHead(Lowerer *this,Instr *instr)

{
  Func *func;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  byte bVar4;
  ObjectType OVar5;
  uint32 offset;
  RegOpnd *baseOpnd;
  undefined4 *puVar6;
  IndirOpnd *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType arrayValueType;
  
  baseOpnd = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar2 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005bf778;
    *puVar6 = 0;
  }
  local_2a[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 &(baseOpnd->super_Opnd).m_valueType.field_0.field_0;
  bVar3 = ValueType::IsAnyOptimizedArray((ValueType *)&local_2a[0].field_0);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c77,"(arrayValueType.IsAnyOptimizedArray())",
                       "arrayValueType.IsAnyOptimizedArray()");
    if (!bVar3) goto LAB_005bf778;
    *puVar6 = 0;
  }
  this_01 = local_2a;
  OVar5 = ValueType::GetObjectType((ValueType *)&this_01->field_0);
  if (OVar5 == ObjectWithArray) {
    baseOpnd = LoadObjectArray((Lowerer *)&this_01->field_0,baseOpnd,instr);
  }
  instr->m_dst->m_type = TyUint64;
  offset = GetArrayOffsetOfHeadSegment((ValueType)local_2a[0].field_0);
  this_00 = IR::IndirOpnd::New(baseOpnd,offset,TyUint64,instr->m_func,false);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005bf778;
    *puVar6 = 0;
  }
  func = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005bf778:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void Lowerer::LowerLdArrHead(IR::Instr *const instr)
{
    IR::RegOpnd *array = instr->UnlinkSrc1()->AsRegOpnd();
    const ValueType arrayValueType(array->GetValueType());
    Assert(arrayValueType.IsAnyOptimizedArray());

    if(arrayValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        array = LoadObjectArray(array, instr);
    }

    // mov arrayHeadSegment, [array + offset(headSegment)]
    instr->GetDst()->SetType(TyMachPtr);
    instr->SetSrc1(
        IR::IndirOpnd::New(
            array,
            GetArrayOffsetOfHeadSegment(arrayValueType),
            TyMachPtr,
            instr->m_func));
    LowererMD::ChangeToAssign(instr);
}